

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintFileDescriptor(Generator *this)

{
  Printer *this_00;
  mapped_type *pmVar1;
  FileDescriptor *pFVar2;
  Syntax syntax;
  int i;
  int iVar3;
  string module_alias;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  char file_descriptor_template [142];
  allocator local_129;
  key_type local_128;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  key_type local_d8;
  key_type local_b8 [4];
  
  local_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_108._M_impl.super__Rb_tree_header._M_header;
  local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108._M_impl.super__Rb_tree_header._M_header._M_right =
       local_108._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)local_b8,"descriptor_name",(allocator *)&local_128);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_108,local_b8);
  std::__cxx11::string::assign((char *)pmVar1);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::string((string *)local_b8,"name",(allocator *)&local_128);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_108,local_b8);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::string((string *)local_b8,"package",(allocator *)&local_128);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_108,local_b8);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::~string((string *)local_b8);
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            (local_b8,(_anonymous_namespace_ *)(ulong)*(uint *)(this->file_ + 0x3c),syntax);
  std::__cxx11::string::string((string *)&local_128,"syntax",(allocator *)&local_d8);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_108,&local_128);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)local_b8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)local_b8);
  MessageLite::SerializeAsString_abi_cxx11_(&local_128,*(MessageLite **)(this->file_ + 0x88));
  OptionsValue(local_b8,this,&local_128);
  std::__cxx11::string::string((string *)&local_d8,"options",&local_129);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_108,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_128);
  memcpy(local_b8,
         "$descriptor_name$ = _descriptor.FileDescriptor(\n  name=\'$name$\',\n  package=\'$package$\',\n  syntax=\'$syntax$\',\n  serialized_options=$options$,\n"
         ,0x8e);
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_108,(char *)local_b8);
  io::Printer::Indent(this->printer_);
  this_00 = this->printer_;
  strings::CHexEscape(&local_128,&this->file_descriptor_serialized_);
  io::Printer::Print<char[6],std::__cxx11::string>
            (this_00,"serialized_pb=_b(\'$value$\')\n",(char (*) [6])0x3ddc42,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  pFVar2 = this->file_;
  if (*(int *)(pFVar2 + 0x20) != 0) {
    io::Printer::Print<>(this->printer_,",\ndependencies=[");
    for (iVar3 = 0; iVar3 < *(int *)(this->file_ + 0x20); iVar3 = iVar3 + 1) {
      pFVar2 = FileDescriptor::dependency(this->file_,iVar3);
      anon_unknown_0::ModuleAlias(&local_128,*(string **)pFVar2);
      io::Printer::Print<char[13],std::__cxx11::string>
                (this->printer_,"$module_alias$.DESCRIPTOR,",(char (*) [13])"module_alias",
                 &local_128);
      std::__cxx11::string::~string((string *)&local_128);
    }
    io::Printer::Print<>(this->printer_,"]");
    pFVar2 = this->file_;
  }
  if (0 < *(int *)(pFVar2 + 0x24)) {
    io::Printer::Print<>(this->printer_,",\npublic_dependencies=[");
    for (iVar3 = 0; iVar3 < *(int *)(this->file_ + 0x24); iVar3 = iVar3 + 1) {
      pFVar2 = FileDescriptor::public_dependency(this->file_,iVar3);
      anon_unknown_0::ModuleAlias(&local_128,*(string **)pFVar2);
      io::Printer::Print<char[13],std::__cxx11::string>
                (this->printer_,"$module_alias$.DESCRIPTOR,",(char (*) [13])"module_alias",
                 &local_128);
      std::__cxx11::string::~string((string *)&local_128);
    }
    io::Printer::Print<>(this->printer_,"]");
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print<>(this->printer_,")\n");
  io::Printer::Print<>(this->printer_,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_108);
  return;
}

Assistant:

void Generator::PrintFileDescriptor() const {
  std::map<std::string, std::string> m;
  m["descriptor_name"] = kDescriptorKey;
  m["name"] = file_->name();
  m["package"] = file_->package();
  m["syntax"] = StringifySyntax(file_->syntax());
  m["options"] = OptionsValue(file_->options().SerializeAsString());
  const char file_descriptor_template[] =
      "$descriptor_name$ = _descriptor.FileDescriptor(\n"
      "  name='$name$',\n"
      "  package='$package$',\n"
      "  syntax='$syntax$',\n"
      "  serialized_options=$options$,\n";
  printer_->Print(m, file_descriptor_template);
  printer_->Indent();
  printer_->Print(
      //##!PY25      "serialized_pb=b'$value$'\n",
      "serialized_pb=_b('$value$')\n",  //##PY25
      "value", strings::CHexEscape(file_descriptor_serialized_));
  if (file_->dependency_count() != 0) {
    printer_->Print(",\ndependencies=[");
    for (int i = 0; i < file_->dependency_count(); ++i) {
      std::string module_alias = ModuleAlias(file_->dependency(i)->name());
      printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                      module_alias);
    }
    printer_->Print("]");
  }
  if (file_->public_dependency_count() > 0) {
    printer_->Print(",\npublic_dependencies=[");
    for (int i = 0; i < file_->public_dependency_count(); ++i) {
      std::string module_alias =
          ModuleAlias(file_->public_dependency(i)->name());
      printer_->Print("$module_alias$.DESCRIPTOR,", "module_alias",
                      module_alias);
    }
    printer_->Print("]");
  }

  // TODO(falk): Also print options and fix the message_type, enum_type,
  //             service and extension later in the generation.

  printer_->Outdent();
  printer_->Print(")\n");
  printer_->Print("\n");
}